

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

char * ByteToHex(uchar *vByte,int vLen)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  char cVar4;
  char cVar5;
  
  if (vByte != (uchar *)0x0) {
    pcVar2 = (char *)operator_new__((long)((int)((long)vLen * 2) + 1));
    if (0 < vLen) {
      uVar3 = 0;
      do {
        bVar1 = vByte[uVar3];
        cVar4 = '7';
        cVar5 = '7';
        if (bVar1 < 0xa0) {
          cVar5 = '0';
        }
        pcVar2[uVar3 * 2] = cVar5 + (bVar1 >> 4);
        if ((bVar1 & 0xf) < 10) {
          cVar4 = '0';
        }
        pcVar2[uVar3 * 2 + 1] = cVar4 + (bVar1 & 0xf);
        uVar3 = uVar3 + 1;
      } while ((uint)vLen != uVar3);
    }
    pcVar2[(long)vLen * 2] = '\0';
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char* ByteToHex(const unsigned char* vByte, const int vLen)
{
	if (!vByte)
	{
		return NULL;
	}

	char* tmp = new char[vLen * 2 + 1];

	int tmp2;
	for (int i = 0; i < vLen; i++)
	{
		tmp2 = (int)(vByte[i]) / 16;
		tmp[i * 2] = (char)(tmp2 + ((tmp2 > 9) ? 'A' - 10 : '0'));
		tmp2 = (int)(vByte[i]) % 16;
		tmp[i * 2 + 1] = (char)(tmp2 + ((tmp2 > 9) ? 'A' - 10 : '0'));
	}

	tmp[vLen * 2] = '\0';
	return tmp;
}